

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O1

mz_bool mz_zip_reader_eocd64_valid(mz_zip_archive *pZip,uint64_t offset,uint8_t *buf)

{
  mz_bool mVar1;
  size_t sVar2;
  
  sVar2 = (*pZip->m_pRead)(pZip->m_pIO_opaque,offset,buf,0x38);
  if ((sVar2 != 0x38) || (mVar1 = 1, *(int *)buf != 0x6064b50)) {
    mVar1 = 0;
  }
  return mVar1;
}

Assistant:

static mz_bool mz_zip_reader_eocd64_valid(mz_zip_archive *pZip, uint64_t offset,
                                          uint8_t *buf) {
  if (pZip->m_pRead(pZip->m_pIO_opaque, offset, buf,
                    MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE) ==
      MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE) {
    if (MZ_READ_LE32(buf + MZ_ZIP64_ECDH_SIG_OFS) ==
        MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIG) {
      return MZ_TRUE;
    }
  }

  return MZ_FALSE;
}